

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O3

int __thiscall ncnn::DetectionOutput::load_param(DetectionOutput *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_class = iVar1;
  fVar2 = ParamDict::get(pd,1,0.05);
  this->nms_threshold = fVar2;
  iVar1 = ParamDict::get(pd,2,300);
  this->nms_top_k = iVar1;
  iVar1 = ParamDict::get(pd,3,100);
  this->keep_top_k = iVar1;
  fVar2 = ParamDict::get(pd,4,0.5);
  this->confidence_threshold = fVar2;
  return 0;
}

Assistant:

int DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 0);
    nms_threshold = pd.get(1, 0.05f);
    nms_top_k = pd.get(2, 300);
    keep_top_k = pd.get(3, 100);
    confidence_threshold = pd.get(4, 0.5f);

    return 0;
}